

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

RPCHelpMan * uptime(void)

{
  string m_key_name;
  RPCResult result;
  string description;
  string description_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  RPCMethodImpl fun;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffd48;
  undefined8 in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  _Manager_type in_stack_fffffffffffffd68;
  undefined8 in_stack_fffffffffffffd70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffffd78;
  pointer pRVar1;
  pointer pRVar2;
  pointer pRVar3;
  _Vector_impl_data in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffdb8 [16];
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  undefined1 in_stack_fffffffffffffde0 [24];
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  char *local_138;
  size_type local_130;
  char local_128 [8];
  undefined8 uStack_120;
  string local_118 [32];
  string local_f8 [32];
  RPCResult local_d8;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"uptime",(allocator<char> *)&stack0xfffffffffffffde7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"\nReturns the total uptime of the server.\n",
             (allocator<char> *)&stack0xfffffffffffffde6);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"",(allocator<char> *)&stack0xfffffffffffffdaf);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"The number of seconds that the server has been running",
             (allocator<char> *)&stack0xfffffffffffffdae);
  pRVar1 = (pointer)0x0;
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffffd50;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd48;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffd58;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffffd60;
  description._M_string_length = in_stack_fffffffffffffd70;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd68;
  description.field_2 = in_stack_fffffffffffffd78;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_d8,NUM,m_key_name,description,inner,SUB81(local_f8,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd50;
  result._0_8_ = in_stack_fffffffffffffd48;
  result.m_key_name._M_string_length = in_stack_fffffffffffffd58;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffffd60;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffffd68;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd70;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffffd78;
  result._64_8_ = pRVar1;
  result.m_description._M_dataplus._M_p = (pointer)pRVar2;
  result.m_description._M_string_length = (size_type)pRVar3;
  result._88_24_ = in_stack_fffffffffffffda0;
  result.m_cond._8_16_ = in_stack_fffffffffffffdb8;
  result.m_cond.field_2._8_8_ = pRVar4;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffffdb0,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"uptime",(allocator<char> *)&stack0xfffffffffffffd87);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b8,"",(allocator<char> *)&stack0xfffffffffffffd86);
  HelpExampleCli(&local_178,&local_198,&local_1b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,"uptime",(allocator<char> *)&stack0xfffffffffffffd85);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffde8,"",(allocator<char> *)&stack0xfffffffffffffd84);
  HelpExampleRpc(&local_1d8,&local_1f8,(string *)&stack0xfffffffffffffde8);
  std::operator+(&local_158,&local_178,&local_1d8);
  local_138 = local_128;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p == &local_158.field_2) {
    uStack_120 = local_158.field_2._8_8_;
  }
  else {
    local_138 = local_158._M_dataplus._M_p;
  }
  local_130 = local_158._M_string_length;
  local_158._M_string_length = 0;
  local_158.field_2._M_local_buf[0] = '\0';
  description_00._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:209:9)>
       ::_M_invoke;
  description_00._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/server.cpp:209:9)>
                ::_M_manager;
  description_00.field_2 = in_stack_fffffffffffffd78;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar1;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar3;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar4;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffffdb8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffffdb8._8_8_;
  examples.m_examples.field_2._8_8_ = pRVar5;
  fun._8_24_ = in_stack_fffffffffffffde0;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar6;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffffd50,&stack0xfffffffffffffd58)),
             description_00,args,(RPCResults)in_stack_fffffffffffffda0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffd58);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffdb0);
  RPCResult::~RPCResult(&local_d8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffffd88);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffffdc8);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan uptime()
{
    return RPCHelpMan{"uptime",
                "\nReturns the total uptime of the server.\n",
                            {},
                            RPCResult{
                                RPCResult::Type::NUM, "", "The number of seconds that the server has been running"
                            },
                RPCExamples{
                    HelpExampleCli("uptime", "")
                + HelpExampleRpc("uptime", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    return GetTime() - GetStartupTime();
}
    };
}